

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

void alloc_parser_working_data(Parser *p)

{
  PNode **ppPVar1;
  SNode **ppSVar2;
  ulong uVar3;
  
  (p->pnode_hash).i = 10;
  uVar3 = (ulong)d_prime2[10];
  (p->pnode_hash).m = d_prime2[10];
  ppPVar1 = (PNode **)calloc(1,uVar3 << 3);
  (p->pnode_hash).v = ppPVar1;
  (p->snode_hash).i = 8;
  uVar3 = (ulong)d_prime2[8];
  (p->snode_hash).m = d_prime2[8];
  ppSVar2 = (SNode **)calloc(1,uVar3 << 3);
  (p->snode_hash).v = ppSVar2;
  p->nshift_results = 0;
  p->ncode_shifts = 0;
  return;
}

Assistant:

static void alloc_parser_working_data(Parser *p) {
  p->pnode_hash.i = PNODE_HASH_INITIAL_SIZE_INDEX;
  p->pnode_hash.m = d_prime2[p->pnode_hash.i];
  p->pnode_hash.v = (PNode **)MALLOC(p->pnode_hash.m * sizeof(*p->pnode_hash.v));
  memset(p->pnode_hash.v, 0, p->pnode_hash.m * sizeof(*p->pnode_hash.v));
  p->snode_hash.i = SNODE_HASH_INITIAL_SIZE_INDEX;
  p->snode_hash.m = d_prime2[p->snode_hash.i];
  p->snode_hash.v = (SNode **)MALLOC(p->snode_hash.m * sizeof(*p->snode_hash.v));
  memset(p->snode_hash.v, 0, p->snode_hash.m * sizeof(*p->snode_hash.v));
  p->nshift_results = 0;
  p->ncode_shifts = 0;
}